

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExternalMakefileProjectGenerator.h
# Opt level: O2

unique_ptr<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>
 __thiscall
cmExternalMakefileProjectGeneratorSimpleFactory<cmExtraCodeBlocksGenerator>::
CreateExternalMakefileProjectGenerator
          (cmExternalMakefileProjectGeneratorSimpleFactory<cmExtraCodeBlocksGenerator> *this)

{
  _func_int **pp_Var1;
  cmExternalMakefileProjectGeneratorFactory *in_RSI;
  string sStack_38;
  
  pp_Var1 = (_func_int **)operator_new(0x48);
  pp_Var1[1] = (_func_int *)0x0;
  pp_Var1[2] = (_func_int *)0x0;
  pp_Var1[3] = (_func_int *)0x0;
  pp_Var1[4] = (_func_int *)0x0;
  pp_Var1[5] = (_func_int *)(pp_Var1 + 7);
  pp_Var1[6] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var1 + 7) = 0;
  *pp_Var1 = (_func_int *)&PTR__cmExternalMakefileProjectGenerator_00994430;
  (this->super_cmExternalMakefileProjectGeneratorFactory).
  _vptr_cmExternalMakefileProjectGeneratorFactory = pp_Var1;
  cmExternalMakefileProjectGeneratorFactory::GetName_abi_cxx11_(&sStack_38,in_RSI);
  std::__cxx11::string::_M_assign((string *)(pp_Var1 + 5));
  std::__cxx11::string::~string((string *)&sStack_38);
  return (__uniq_ptr_data<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>,_true,_true>
          )(__uniq_ptr_data<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<cmExternalMakefileProjectGenerator>
  CreateExternalMakefileProjectGenerator() const override
  {
    std::unique_ptr<cmExternalMakefileProjectGenerator> p(new T);
    p->SetName(this->GetName());
    return p;
  }